

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app_writer.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  int iVar2;
  mbedtls_pk_type_t mVar3;
  char *pcVar4;
  mbedtls_rsa_context *pmVar5;
  mbedtls_ecp_keypair *pmVar6;
  char *__s1;
  mbedtls_ecp_keypair *ecp_1;
  mbedtls_rsa_context *rsa_1;
  mbedtls_ecp_keypair *ecp;
  mbedtls_rsa_context *rsa;
  char *q;
  char *p;
  char local_438 [4];
  int i;
  char buf [1024];
  undefined1 local_30 [8];
  mbedtls_pk_context key;
  int ret;
  char **argv_local;
  int argc_local;
  
  key.pk_ctx._4_4_ = 0;
  mbedtls_pk_init((mbedtls_pk_context *)local_30);
  memset(local_438,0,0x400);
  if (argc == 0) {
LAB_0010a2c4:
    key.pk_ctx._4_4_ = 1;
    printf(
          "\n usage: key_app param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    output_mode=private|public default: none\n    output_file=%%s      default: keyfile.pem\n    output_format=pem|der default: pem\n\n"
          );
  }
  else {
    opt.mode = 0;
    opt.filename = "keyfile.key";
    opt.output_mode = 0;
    opt.output_file = "keyfile.pem";
    opt.output_format = 0;
    for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
      __s = argv[p._4_4_];
      pcVar4 = strchr(__s,0x3d);
      if (pcVar4 == (char *)0x0) goto LAB_0010a2c4;
      __s1 = pcVar4 + 1;
      *pcVar4 = '\0';
      iVar2 = strcmp(__s,"mode");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1,"private");
        if (iVar2 == 0) {
          opt.mode = 1;
          pcVar4 = opt.filename;
          pcVar1 = opt.output_file;
        }
        else {
          iVar2 = strcmp(__s1,"public");
          if (iVar2 != 0) goto LAB_0010a2c4;
          opt.mode = 2;
          pcVar4 = opt.filename;
          pcVar1 = opt.output_file;
        }
      }
      else {
        iVar2 = strcmp(__s,"output_mode");
        if (iVar2 == 0) {
          iVar2 = strcmp(__s1,"private");
          if (iVar2 == 0) {
            opt.output_mode = 1;
            pcVar4 = opt.filename;
            pcVar1 = opt.output_file;
          }
          else {
            iVar2 = strcmp(__s1,"public");
            if (iVar2 != 0) goto LAB_0010a2c4;
            opt.output_mode = 2;
            pcVar4 = opt.filename;
            pcVar1 = opt.output_file;
          }
        }
        else {
          iVar2 = strcmp(__s,"output_format");
          if (iVar2 == 0) {
            iVar2 = strcmp(__s1,"pem");
            if (iVar2 == 0) {
              opt.output_format = 0;
              pcVar4 = opt.filename;
              pcVar1 = opt.output_file;
            }
            else {
              iVar2 = strcmp(__s1,"der");
              if (iVar2 != 0) goto LAB_0010a2c4;
              opt.output_format = 1;
              pcVar4 = opt.filename;
              pcVar1 = opt.output_file;
            }
          }
          else {
            iVar2 = strcmp(__s,"filename");
            pcVar4 = __s1;
            pcVar1 = opt.output_file;
            if ((iVar2 != 0) &&
               (iVar2 = strcmp(__s,"output_file"), pcVar4 = opt.filename, pcVar1 = __s1, iVar2 != 0)
               ) goto LAB_0010a2c4;
          }
        }
      }
      opt.output_file = pcVar1;
      opt.filename = pcVar4;
    }
    if ((opt.mode == 0) && (opt.output_mode != 0)) {
      printf("\nCannot output a key without reading one.\n");
      goto LAB_0010a9fa;
    }
    if ((opt.mode == 2) && (opt.output_mode == 1)) {
      printf("\nCannot output a private key from a public key.\n");
      goto LAB_0010a9fa;
    }
    if (opt.mode == 1) {
      printf("\n  . Loading the private key ...");
      fflush(_stdout);
      key.pk_ctx._4_4_ =
           mbedtls_pk_parse_keyfile((mbedtls_pk_context *)local_30,opt.filename,(char *)0x0);
      if (key.pk_ctx._4_4_ != 0) {
        mbedtls_strerror(key.pk_ctx._4_4_,local_438,0x400);
        printf(" failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n",
               (ulong)(uint)-key.pk_ctx._4_4_,local_438);
        goto LAB_0010a9fa;
      }
      printf(" ok\n");
      printf("  . Key information    ...\n");
      mVar3 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
      if (mVar3 == MBEDTLS_PK_RSA) {
        pmVar5 = mbedtls_pk_rsa(_local_30);
        mbedtls_mpi_write_file("N:  ",&pmVar5->N,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("E:  ",&pmVar5->E,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("D:  ",&pmVar5->D,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("P:  ",&pmVar5->P,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("Q:  ",&pmVar5->Q,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("DP: ",&pmVar5->DP,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("DQ:  ",&pmVar5->DQ,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("QP:  ",&pmVar5->QP,0x10,(FILE *)0x0);
      }
      else {
        mVar3 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
        if (mVar3 == MBEDTLS_PK_ECKEY) {
          pmVar6 = mbedtls_pk_ec(_local_30);
          mbedtls_mpi_write_file("Q(X): ",&(pmVar6->Q).X,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q(Y): ",&(pmVar6->Q).Y,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q(Z): ",&(pmVar6->Q).Z,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("D   : ",&pmVar6->d,0x10,(FILE *)0x0);
        }
        else {
          printf("key type not supported yet\n");
        }
      }
    }
    else {
      if (opt.mode != 2) goto LAB_0010a2c4;
      printf("\n  . Loading the public key ...");
      fflush(_stdout);
      key.pk_ctx._4_4_ =
           mbedtls_pk_parse_public_keyfile((mbedtls_pk_context *)local_30,opt.filename);
      if (key.pk_ctx._4_4_ != 0) {
        mbedtls_strerror(key.pk_ctx._4_4_,local_438,0x400);
        printf(" failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n",
               (ulong)(uint)-key.pk_ctx._4_4_,local_438);
        goto LAB_0010a9fa;
      }
      printf(" ok\n");
      printf("  . Key information    ...\n");
      mVar3 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
      if (mVar3 == MBEDTLS_PK_RSA) {
        pmVar5 = mbedtls_pk_rsa(_local_30);
        mbedtls_mpi_write_file("N: ",&pmVar5->N,0x10,(FILE *)0x0);
        mbedtls_mpi_write_file("E: ",&pmVar5->E,0x10,(FILE *)0x0);
      }
      else {
        mVar3 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
        if (mVar3 == MBEDTLS_PK_ECKEY) {
          pmVar6 = mbedtls_pk_ec(_local_30);
          mbedtls_mpi_write_file("Q(X): ",&(pmVar6->Q).X,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q(Y): ",&(pmVar6->Q).Y,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q(Z): ",&(pmVar6->Q).Z,0x10,(FILE *)0x0);
        }
        else {
          printf("key type not supported yet\n");
        }
      }
    }
    if (opt.output_mode == 2) {
      write_public_key((mbedtls_pk_context *)local_30,opt.output_file);
    }
    if (opt.output_mode == 1) {
      write_private_key((mbedtls_pk_context *)local_30,opt.output_file);
    }
  }
LAB_0010a9fa:
  if ((key.pk_ctx._4_4_ != 0) && (key.pk_ctx._4_4_ != 1)) {
    mbedtls_strerror(key.pk_ctx._4_4_,local_438,0x400);
    printf(" - %s\n",local_438);
  }
  mbedtls_pk_free((mbedtls_pk_context *)local_30);
  return key.pk_ctx._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &key );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        ret = 1;
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.output_mode         = DFL_OUTPUT_MODE;
    opt.output_file         = DFL_OUTPUT_FILENAME;
    opt.output_format       = DFL_OUTPUT_FORMAT;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.output_mode = OUTPUT_MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "output_format" ) == 0 )
        {
#if defined(MBEDTLS_PEM_WRITE_C)
            if( strcmp( q, "pem" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_PEM;
            else
#endif
            if( strcmp( q, "der" ) == 0 )
                opt.output_format = OUTPUT_FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_NONE && opt.output_mode != OUTPUT_MODE_NONE )
    {
        mbedtls_printf( "\nCannot output a key without reading one.\n");
        goto exit;
    }

    if( opt.mode == MODE_PUBLIC && opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        mbedtls_printf( "\nCannot output a private key from a public key.\n");
        goto exit;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &key, opt.filename, NULL );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );
            mbedtls_mpi_write_file( "N:  ",  &rsa->N,  16, NULL );
            mbedtls_mpi_write_file( "E:  ",  &rsa->E,  16, NULL );
            mbedtls_mpi_write_file( "D:  ",  &rsa->D,  16, NULL );
            mbedtls_mpi_write_file( "P:  ",  &rsa->P,  16, NULL );
            mbedtls_mpi_write_file( "Q:  ",  &rsa->Q,  16, NULL );
            mbedtls_mpi_write_file( "DP: ",  &rsa->DP, 16, NULL );
            mbedtls_mpi_write_file( "DQ:  ", &rsa->DQ, 16, NULL );
            mbedtls_mpi_write_file( "QP:  ", &rsa->QP, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
            mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");

    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &key, opt.filename );

        if( ret != 0 )
        {
            mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_key returned -0x%04x - %s\n\n", -ret, buf );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );

#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );
            mbedtls_mpi_write_file( "N: ", &rsa->N, 16, NULL );
            mbedtls_mpi_write_file( "E: ", &rsa->E, 16, NULL );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
            mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL );
            mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL );
            mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL );
        }
        else
#endif
            mbedtls_printf("key type not supported yet\n");
    }
    else
        goto usage;

    if( opt.output_mode == OUTPUT_MODE_PUBLIC )
    {
        write_public_key( &key, opt.output_file );
    }
    if( opt.output_mode == OUTPUT_MODE_PRIVATE )
    {
        write_private_key( &key, opt.output_file );
    }

exit:

    if( ret != 0 && ret != 1)
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_pk_free( &key );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}